

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O2

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo6(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double m10;
  double m01;
  double local_118;
  double dStack_110;
  double local_100;
  uint64_t local_f8;
  double m00;
  double local_e8;
  uint64_t local_d8 [21];
  
  m00 = 0.0;
  m01 = 0.0;
  local_100 = getNormalMoment(this,(uint64_t *)&m00,(uint64_t *)&m01);
  m01 = 0.0;
  m10 = 4.94065645841247e-324;
  m00 = local_100;
  m01 = getNormalMoment(this,(uint64_t *)&m01,(uint64_t *)&m10);
  m10 = 4.94065645841247e-324;
  local_f8 = 0;
  m10 = getNormalMoment(this,(uint64_t *)&m10,&local_f8);
  local_f8 = 2;
  local_d8[0x14] = 0;
  dVar1 = getCentralMoment(this,&local_f8,local_d8 + 0x14,&m00,&m10,&m01);
  local_d8[0x13] = 0;
  local_d8[0x12] = 2;
  dVar2 = getCentralMoment(this,local_d8 + 0x13,local_d8 + 0x12,&m00,&m10,&m01);
  local_d8[0x11] = 3;
  local_d8[0x10] = 0;
  dVar3 = getCentralMoment(this,local_d8 + 0x11,local_d8 + 0x10,&m00,&m10,&m01);
  local_d8[0xf] = 1;
  local_d8[0xe] = 2;
  local_118 = getCentralMoment(this,local_d8 + 0xf,local_d8 + 0xe,&m00,&m10,&m01);
  local_d8[0xd] = 2;
  local_d8[0xc] = 1;
  local_e8 = getCentralMoment(this,local_d8 + 0xd,local_d8 + 0xc,&m00,&m10,&m01);
  local_d8[0xb] = 0;
  local_d8[10] = 3;
  dVar4 = getCentralMoment(this,local_d8 + 0xb,local_d8 + 10,&m00,&m10,&m01);
  dStack_110 = (dVar4 + local_e8) * (dVar4 + local_e8);
  local_118 = ((local_118 + dVar3) * (local_118 + dVar3) - dStack_110) * (dVar1 - dVar2);
  local_d8[9] = 1;
  local_d8[8] = 1;
  dVar1 = getCentralMoment(this,local_d8 + 9,local_d8 + 8,&m00,&m10,&m01);
  local_d8[7] = 3;
  local_d8[6] = 0;
  dVar2 = getCentralMoment(this,local_d8 + 7,local_d8 + 6,&m00,&m10,&m01);
  local_d8[5] = 1;
  local_d8[4] = 2;
  dVar3 = getCentralMoment(this,local_d8 + 5,local_d8 + 4,&m00,&m10,&m01);
  local_d8[3] = 2;
  local_d8[2] = 1;
  dVar4 = getCentralMoment(this,local_d8 + 3,local_d8 + 2,&m00,&m10,&m01);
  local_d8[1] = 0;
  local_d8[0] = 3;
  dVar5 = getCentralMoment(this,local_d8 + 1,local_d8,&m00,&m10,&m01);
  dVar1 = (dVar5 + dVar4) * (dVar3 + dVar2) * dVar1 * 4.0 + local_118;
  dVar2 = pow(local_100,7.0);
  return dVar1 / dVar2;
}

Assistant:

const double
Segment::getHuMomentInvariantNo6()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            (
                (
                    this->getCentralMoment(2, 0, m00, m10, m01) -
                    this->getCentralMoment(0, 2, m00, m10, m01)
                )
                *
                (
                    std::pow(
                        (
                            this->getCentralMoment(3, 0, m00, m10, m01) +
                            this->getCentralMoment(1, 2, m00, m10, m01)
                        ),
                        2
                    )
                    -
                    std::pow(
                        (
                            this->getCentralMoment(2, 1, m00, m10, m01) +
                            this->getCentralMoment(0, 3, m00, m10, m01)
                        ),
                        2
                    )
                )
            )
            +
            (
                (
                    4 *
                    this->getCentralMoment(1, 1, m00, m10, m01)
                )
                *
                (
                    this->getCentralMoment(3, 0, m00, m10, m01) +
                    this->getCentralMoment(1, 2, m00, m10, m01)
                )
                *
                (
                    this->getCentralMoment(2, 1, m00, m10, m01) +
                    this->getCentralMoment(0, 3, m00, m10, m01)
                )
            )
        )
        /
        std::pow(m00, 7)
    );
}